

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O3

void __thiscall aiCamera::GetCameraMatrix(aiCamera *this,aiMatrix4x4 *out)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  fVar1 = (this->mLookAt).x;
  fVar2 = (this->mUp).x;
  uVar6 = (this->mLookAt).y;
  uVar8 = (this->mLookAt).z;
  fVar11 = 1.0 / SQRT((float)uVar8 * (float)uVar8 + fVar1 * fVar1 + (float)uVar6 * (float)uVar6);
  uVar7 = (this->mUp).y;
  uVar9 = (this->mUp).z;
  fVar13 = 1.0 / SQRT((float)uVar9 * (float)uVar9 + fVar2 * fVar2 + (float)uVar7 * (float)uVar7);
  fVar14 = (float)uVar8 * (float)uVar7 - (float)uVar9 * (float)uVar6;
  fVar15 = fVar1 * (float)uVar9 - fVar2 * (float)uVar8;
  fVar10 = fVar2 * (float)uVar6 - fVar1 * (float)uVar7;
  fVar12 = 1.0 / SQRT(fVar10 * fVar10 + fVar14 * fVar14 + fVar15 * fVar15);
  out->a4 = -((this->mPosition).z * fVar10 * fVar12 +
             (this->mPosition).x * fVar12 * fVar14 + fVar12 * fVar15 * (this->mPosition).y);
  out->b4 = -(fVar13 * (float)uVar9 * (this->mPosition).z +
             (this->mPosition).x * fVar2 * fVar13 + (this->mPosition).y * fVar13 * (float)uVar7);
  fVar3 = (this->mPosition).y;
  fVar4 = (this->mPosition).x;
  fVar5 = (this->mPosition).z;
  out->a1 = fVar12 * fVar14;
  out->a2 = fVar12 * fVar15;
  out->a3 = fVar10 * fVar12;
  out->b1 = fVar2 * fVar13;
  out->b2 = fVar13 * (float)uVar7;
  out->b3 = fVar13 * (float)uVar9;
  out->c1 = fVar1 * fVar11;
  out->c4 = -(fVar11 * (float)uVar8 * fVar5 + fVar4 * fVar1 * fVar11 + fVar3 * fVar11 * (float)uVar6
             );
  out->c2 = fVar11 * (float)uVar6;
  out->c3 = fVar11 * (float)uVar8;
  out->d1 = 0.0;
  out->d2 = 0.0;
  out->d3 = 0.0;
  out->d4 = 1.0;
  return;
}

Assistant:

void GetCameraMatrix (aiMatrix4x4& out) const
    {
        /** todo: test ... should work, but i'm not absolutely sure */

        /** We don't know whether these vectors are already normalized ...*/
        aiVector3D zaxis = mLookAt;     zaxis.Normalize();
        aiVector3D yaxis = mUp;         yaxis.Normalize();
        aiVector3D xaxis = mUp^mLookAt; xaxis.Normalize();

        out.a4 = -(xaxis * mPosition);
        out.b4 = -(yaxis * mPosition);
        out.c4 = -(zaxis * mPosition);

        out.a1 = xaxis.x;
        out.a2 = xaxis.y;
        out.a3 = xaxis.z;

        out.b1 = yaxis.x;
        out.b2 = yaxis.y;
        out.b3 = yaxis.z;

        out.c1 = zaxis.x;
        out.c2 = zaxis.y;
        out.c3 = zaxis.z;

        out.d1 = out.d2 = out.d3 = 0.f;
        out.d4 = 1.f;
    }